

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O3

int __thiscall anon_unknown.dwarf_e2e2::VideoState::handler(VideoState *this)

{
  PacketQueue<14680064UL> *this_00;
  mutex *__mutex;
  _Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter> _Var1;
  AVRational AVar2;
  AVCodecContext *codecctx;
  __int_type_conflict _Var3;
  unique_lock *puVar4;
  array<(anonymous_namespace)::VideoState::Picture,_24UL> *paVar5;
  int iVar6;
  pointer __p;
  pointer __p_00;
  rep rVar7;
  long *plVar8;
  undefined8 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  double dVar12;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_60;
  long local_50;
  unique_lock *local_48;
  mutex *local_40;
  array<(anonymous_namespace)::VideoState::Picture,_24UL> *local_38;
  
  lVar11 = 0x110;
  do {
    __p_00 = (pointer)av_frame_alloc();
    local_60._M_device = (mutex *)0x0;
    std::__uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::reset
              ((__uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)
               ((long)&this->mMovie + lVar11),__p_00);
    std::unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter>::~unique_ptr
              ((unique_ptr<AVFrame,_(anonymous_namespace)::AVFrameDeleter> *)&local_60);
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x290);
  local_38 = &this->mPictQ;
  this_00 = &this->mPackets;
  do {
    iVar6 = PacketQueue<14680064UL>::sendTo
                      (this_00,(this->mCodecCtx)._M_t.
                               super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                               .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl);
    if (iVar6 == -0xb) break;
  } while (iVar6 != -0x20464f45);
  __mutex = &this->mDispPtsMutex;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
    uVar9 = std::__throw_system_error(iVar6);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar9);
  }
  rVar7 = av_gettime();
  (this->mDisplayPtsTime).__r = rVar7;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (((this->mMovie->mQuit)._M_base._M_i & 1U) == 0) {
    local_40 = &this->mPictQMutex;
    local_48 = (unique_lock *)&this->mPictQCond;
    local_50 = 0;
    do {
      paVar5 = local_38;
      _Var10 = (this->mPictQWrite).super___atomic_base<unsigned_long>._M_i;
      _Var1.super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl =
           local_38->_M_elems[_Var10].mFrame._M_t.
           super___uniq_ptr_impl<AVFrame,_(anonymous_namespace)::AVFrameDeleter>._M_t.
           super__Tuple_impl<0UL,_AVFrame_*,_(anonymous_namespace)::AVFrameDeleter>.
           super__Head_base<0UL,_AVFrame_*,_false>;
      while (iVar6 = avcodec_receive_frame
                               ((this->mCodecCtx)._M_t.
                                super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                                .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl,
                                _Var1.super__Head_base<0UL,_AVFrame_*,_false>._M_head_impl),
            iVar6 == -0xb) {
        PacketQueue<14680064UL>::sendTo
                  (this_00,(this->mCodecCtx)._M_t.
                           super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                           .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl);
      }
      if (iVar6 == -0x20464f45) break;
      if (iVar6 == 0) {
        AVar2 = this->mStream->time_base;
        local_50 = (long)((double)*(long *)((long)_Var1.super__Head_base<0UL,_AVFrame_*,_false>.
                                                  _M_head_impl + 0x198) *
                          ((double)AVar2.num / (double)AVar2.den) * 1000000000.0);
        paVar5->_M_elems[_Var10].mPts.__r = local_50;
        codecctx = (this->mCodecCtx)._M_t.
                   super___uniq_ptr_impl<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_AVCodecContext_*,_(anonymous_namespace)::AVCodecCtxDeleter>
                   .super__Head_base<0UL,_AVCodecContext_*,_false>._M_head_impl;
        AVar2 = codecctx->time_base;
        dVar12 = (double)AVar2.num / (double)AVar2.den;
        local_50 = (long)((dVar12 * 0.5 *
                           (double)*(int *)((long)_Var1.super__Head_base<0UL,_AVFrame_*,_false>.
                                                  _M_head_impl + 0xf8) + dVar12) * 1000000000.0) +
                   local_50;
        _Var10 = _Var10 + 1 + ((_Var10 + 1) / 3 & 0xfffffffffffffff8) * -3;
        (this->mPictQWrite).super___atomic_base<unsigned_long>._M_i = _Var10;
        PacketQueue<14680064UL>::sendTo(this_00,codecctx);
        if (_Var10 == (this->mPictQRead).super___atomic_base<unsigned_long>._M_i) {
          local_60._M_device = local_40;
          local_60._M_owns = false;
          std::unique_lock<std::mutex>::lock(&local_60);
          puVar4 = local_48;
          local_60._M_owns = true;
          _Var3 = (this->mPictQRead).super___atomic_base<unsigned_long>._M_i;
          while ((_Var10 == _Var3 && (((this->mMovie->mQuit)._M_base._M_i & 1U) == 0))) {
            std::condition_variable::wait(puVar4);
            _Var3 = (this->mPictQRead).super___atomic_base<unsigned_long>._M_i;
          }
          std::unique_lock<std::mutex>::~unique_lock(&local_60);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to receive frame: ",0x19);
        plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar6);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
      }
    } while (((this->mMovie->mQuit)._M_base._M_i & 1U) == 0);
  }
  LOCK();
  (this->mEOS)._M_base._M_i = true;
  UNLOCK();
  local_60._M_device = &this->mPictQMutex;
  local_60._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_60);
  local_60._M_owns = true;
  if (((this->mFinalUpdate)._M_base._M_i & 1U) == 0) {
    do {
      std::condition_variable::wait((unique_lock *)&this->mPictQCond);
    } while (((this->mFinalUpdate)._M_base._M_i & 1U) == 0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  return 0;
}

Assistant:

int VideoState::handler()
{
    std::for_each(mPictQ.begin(), mPictQ.end(),
        [](Picture &pict) -> void
        { pict.mFrame = AVFramePtr{av_frame_alloc()}; });

    /* Prefill the codec buffer. */
    do {
        const int ret{mPackets.sendTo(mCodecCtx.get())};
        if(ret == AVERROR(EAGAIN) || ret == AVErrorEOF)
            break;
    } while(1);

    {
        std::lock_guard<std::mutex> _{mDispPtsMutex};
        mDisplayPtsTime = get_avtime();
    }

    auto current_pts = nanoseconds::zero();
    while(!mMovie.mQuit.load(std::memory_order_relaxed))
    {
        size_t write_idx{mPictQWrite.load(std::memory_order_relaxed)};
        Picture *vp{&mPictQ[write_idx]};

        /* Retrieve video frame. */
        AVFrame *decoded_frame{vp->mFrame.get()};
        int ret;
        while((ret=avcodec_receive_frame(mCodecCtx.get(), decoded_frame)) == AVERROR(EAGAIN))
            mPackets.sendTo(mCodecCtx.get());
        if(ret != 0)
        {
            if(ret == AVErrorEOF) break;
            std::cerr<< "Failed to receive frame: "<<ret <<std::endl;
            continue;
        }

        /* Get the PTS for this frame. */
        if(decoded_frame->best_effort_timestamp != AVNoPtsValue)
            current_pts = duration_cast<nanoseconds>(seconds_d64{av_q2d(mStream->time_base) *
                static_cast<double>(decoded_frame->best_effort_timestamp)});
        vp->mPts = current_pts;

        /* Update the video clock to the next expected PTS. */
        auto frame_delay = av_q2d(mCodecCtx->time_base);
        frame_delay += decoded_frame->repeat_pict * (frame_delay * 0.5);
        current_pts += duration_cast<nanoseconds>(seconds_d64{frame_delay});

        /* Put the frame in the queue to be loaded into a texture and displayed
         * by the rendering thread.
         */
        write_idx = (write_idx+1)%mPictQ.size();
        mPictQWrite.store(write_idx, std::memory_order_release);

        /* Send a packet now so it's hopefully ready by the time it's needed. */
        mPackets.sendTo(mCodecCtx.get());

        if(write_idx == mPictQRead.load(std::memory_order_acquire))
        {
            /* Wait until we have space for a new pic */
            std::unique_lock<std::mutex> lock{mPictQMutex};
            while(write_idx == mPictQRead.load(std::memory_order_acquire) &&
                !mMovie.mQuit.load(std::memory_order_relaxed))
                mPictQCond.wait(lock);
        }
    }
    mEOS = true;

    std::unique_lock<std::mutex> lock{mPictQMutex};
    while(!mFinalUpdate) mPictQCond.wait(lock);

    return 0;
}